

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O0

void __thiscall Clasp::ClaspFacade::SolveData::~SolveData(SolveData *this)

{
  SolveData *in_RDI;
  BoundArray *unaff_retaddr;
  
  reset(in_RDI);
  BoundArray::~BoundArray(unaff_retaddr);
  BoundArray::~BoundArray(unaff_retaddr);
  SingleOwnerPtr<Clasp::SolveAlgorithm,_Clasp::DeleteObject>::~SingleOwnerPtr
            ((SingleOwnerPtr<Clasp::SolveAlgorithm,_Clasp::DeleteObject> *)0x131114);
  SingleOwnerPtr<Clasp::Enumerator,_Clasp::DeleteObject>::~SingleOwnerPtr
            ((SingleOwnerPtr<Clasp::Enumerator,_Clasp::DeleteObject> *)0x13111e);
  return;
}

Assistant:

~SolveData() { reset(); }